

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool libtorrent::has_parent_path(string *f)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  int local_1c;
  int len;
  string *f_local;
  
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = is_root_path(f);
    if (bVar1) {
      f_local._7_1_ = false;
    }
    else {
      iVar2 = ::std::__cxx11::string::size();
      local_1c = iVar2 + -1;
      pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)f);
      if ((*pcVar4 == '/') ||
         (pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)f), *pcVar4 == '\\')) {
        local_1c = iVar2 + -2;
      }
      while (((-1 < local_1c &&
              (pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)f), *pcVar4 != '/')) &&
             (pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)f), *pcVar4 != '\\'))) {
        local_1c = local_1c + -1;
      }
      f_local._7_1_ = -1 < local_1c;
    }
  }
  else {
    f_local._7_1_ = false;
  }
  return f_local._7_1_;
}

Assistant:

bool has_parent_path(std::string const& f)
	{
		if (f.empty()) return false;
		if (is_root_path(f)) return false;

		int len = int(f.size()) - 1;
		// if the last character is / or \ ignore it
		if (f[std::size_t(len)] == '/' || f[std::size_t(len)] == '\\') --len;
		while (len >= 0)
		{
			if (f[std::size_t(len)] == '/' || f[std::size_t(len)] == '\\')
				break;
			--len;
		}

		return len >= 0;
	}